

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexReader::readFaceData
          (PtexReader *this,FilePos pos,FaceDataHeader fdh,Res res,int levelid,FaceData **face)

{
  ushort uVar1;
  int iVar2;
  DataType DVar3;
  int iVar4;
  PtexReader *pPVar5;
  pthread_mutex_t *__mutex;
  int vw;
  uint32_t uw;
  undefined1 *puVar6;
  TiledFace *this_00;
  ulong uVar7;
  byte bVar8;
  undefined6 in_register_0000000a;
  uint zipsize;
  uint uVar9;
  size_t sVar10;
  undefined1 *puVar11;
  int size;
  int npixels;
  undefined1 auStack_78 [8];
  FaceData **local_70;
  ulong local_68;
  pthread_mutex_t *local_60;
  int local_58;
  int local_54;
  uint32_t tileheadersize;
  uint local_4c;
  TiledFace *local_48;
  Res local_3a;
  int local_38;
  undefined4 uStack_34;
  Res tileres;
  
  puVar11 = auStack_78;
  local_60 = (pthread_mutex_t *)&this->readlock;
  local_38 = levelid;
  pthread_mutex_lock(local_60);
  puVar6 = auStack_78;
  if (*face == (FaceData *)0x0) {
    uStack_34 = (undefined4)CONCAT62(in_register_0000000a,res);
    local_70 = face;
    local_4c = fdh.data;
    seek(this,pos);
    uVar9 = local_4c >> 0x1e;
    if (uVar9 - 1 < 2) {
      tileheadersize = 1 << ((byte)uStack_34 & 0x1f);
      bVar8 = (byte)((uint)uStack_34 >> 8);
      local_54 = 1 << (bVar8 & 0x1f);
      npixels = tileheadersize << (bVar8 & 0x1f);
      iVar2 = this->_pixelsize;
      local_48 = (TiledFace *)operator_new(0x18);
      size = iVar2 * npixels;
      PackedFace::PackedFace((PackedFace *)local_48,SUB42(uStack_34,0),iVar2,size);
      local_68 = (ulong)size;
      if (size < 0x4001) {
        puVar11 = auStack_78 + -(local_68 + 0xf & 0xfffffffffffffff0);
        puVar6 = puVar11;
      }
      else {
        puVar6 = (undefined1 *)operator_new__(local_68);
        puVar11 = auStack_78;
      }
      zipsize = local_4c & 0x3fffffff;
      *(undefined8 *)(puVar11 + -8) = 0x5646a5;
      readZipBlock(this,puVar6,zipsize,size);
      if (uVar9 == 2) {
        DVar3 = (this->_header).datatype;
        *(undefined8 *)(puVar11 + -8) = 0x5646bc;
        PtexUtils::decodeDifference(puVar6,size,DVar3);
      }
      uw = tileheadersize;
      vw = local_54;
      uVar7 = (ulong)(this->_header).datatype;
      iVar2 = *(int *)(DataSize(Ptex::v2_2::DataType)::sizes + uVar7 * 4);
      bVar8 = (byte)uStack_34;
      iVar4 = this->_pixelsize;
      pPVar5 = (local_48->super_TiledFaceBase)._reader;
      *(ulong *)(puVar11 + -8) = (ulong)(this->_header).nchannels;
      *(ulong *)(puVar11 + -0x10) = uVar7;
      *(undefined8 *)(puVar11 + -0x18) = 0x564701;
      PtexUtils::interleave
                (puVar6,iVar2 << (bVar8 & 0x1f),uw,vw,pPVar5,iVar4 << (bVar8 & 0x1f),
                 *(DataType *)(puVar11 + -0x10),*(int *)(puVar11 + -8));
      if ((local_38 == 0) && (this->_premultiply == true)) {
        iVar2 = (this->_header).alphachan;
        uVar1 = (this->_header).nchannels;
        if (iVar2 < (int)(uint)uVar1 && -1 < iVar2) {
          pPVar5 = (local_48->super_TiledFaceBase)._reader;
          DVar3 = (this->_header).datatype;
          *(undefined8 *)(puVar11 + -8) = 0x564749;
          PtexUtils::multalpha(pPVar5,npixels,DVar3,(uint)uVar1,iVar2);
        }
      }
      sVar10 = local_68 + 0x18;
      this_00 = local_48;
      if (0x4000 < size) {
        *(undefined8 *)(puVar11 + -8) = 0x564762;
        operator_delete__(puVar6);
        this_00 = local_48;
      }
    }
    else if (local_4c >> 0x1e == 0) {
      this_00 = (TiledFace *)operator_new(0x18);
      ConstantFace::ConstantFace((ConstantFace *)this_00,this->_pixelsize);
      iVar2 = this->_pixelsize;
      readBlock(this,(this_00->super_TiledFaceBase)._reader,iVar2,true);
      sVar10 = (long)iVar2 + 0x18;
      puVar11 = auStack_78;
      if ((local_38 == 0) && (puVar11 = auStack_78, this->_premultiply == true)) {
        iVar2 = (this->_header).alphachan;
        uVar1 = (this->_header).nchannels;
        puVar11 = auStack_78;
        if (iVar2 < (int)(uint)uVar1 && -1 < iVar2) {
          PtexUtils::multalpha
                    ((this_00->super_TiledFaceBase)._reader,1,(this->_header).datatype,(uint)uVar1,
                     iVar2);
          puVar11 = auStack_78;
        }
      }
    }
    else {
      local_3a.ulog2 = '\0';
      local_3a.vlog2 = '\0';
      readBlock(this,&local_3a,2,true);
      readBlock(this,&local_58,4,true);
      this_00 = (TiledFace *)operator_new(0x88);
      TiledFace::TiledFace(this_00,this,SUB42(uStack_34,0),local_3a,local_38);
      sVar10 = TiledFace::memUsed(this_00);
      readZipBlock(this,(this_00->_fdh).
                        super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                        ._M_impl.super__Vector_impl_data._M_start,local_58,
                   (this_00->super_TiledFaceBase)._ntiles << 2);
      computeOffsets(this,this->_pos,(this_00->super_TiledFaceBase)._ntiles,
                     (this_00->_fdh).
                     super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this_00->_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start);
    }
    *local_70 = (FaceData *)this_00;
    puVar6 = puVar11;
    if (sVar10 != 0) {
      LOCK();
      this->_memUsed = this->_memUsed + sVar10;
      UNLOCK();
    }
  }
  __mutex = local_60;
  *(undefined8 *)(puVar6 + -8) = 0x564786;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void PtexReader::readFaceData(FilePos pos, FaceDataHeader fdh, Res res, int levelid,
                              FaceData*& face)
{
    AutoMutex locker(readlock);
    if (face) {
        return;
    }

    // keep new face local until fully initialized
    FaceData* newface = 0;
    size_t newMemUsed = 0;

    seek(pos);
    switch (fdh.encoding()) {
    case enc_constant:
        {
            ConstantFace* cf = new ConstantFace(_pixelsize);
            newface = cf;
            newMemUsed = sizeof(ConstantFace) + _pixelsize;
            readBlock(cf->data(), _pixelsize);
            if (levelid==0 && _premultiply && _header.hasAlpha())
                PtexUtils::multalpha(cf->data(), 1, datatype(),
                                     _header.nchannels, _header.alphachan);
        }
        break;
    case enc_tiled:
        {
            Res tileres;
            readBlock(&tileres, sizeof(tileres));
            uint32_t tileheadersize;
            readBlock(&tileheadersize, sizeof(tileheadersize));
            TiledFace* tf = new TiledFace(this, res, tileres, levelid);
            newface = tf;
            newMemUsed = tf->memUsed();
            readZipBlock(&tf->_fdh[0], tileheadersize, FaceDataHeaderSize * tf->_ntiles);
            computeOffsets(tell(), tf->_ntiles, &tf->_fdh[0], &tf->_offsets[0]);
        }
        break;
    case enc_zipped:
    case enc_diffzipped:
        {
            int uw = res.u(), vw = res.v();
            int npixels = uw * vw;
            int unpackedSize = _pixelsize * npixels;
            PackedFace* pf = new PackedFace(res, _pixelsize, unpackedSize);
            newface = pf;
            newMemUsed = sizeof(PackedFace) + unpackedSize;
            bool useNew = unpackedSize > AllocaMax;
            char* tmp = useNew ? new char [unpackedSize] : (char*) alloca(unpackedSize);
            readZipBlock(tmp, fdh.blocksize(), unpackedSize);
            if (fdh.encoding() == enc_diffzipped)
                PtexUtils::decodeDifference(tmp, unpackedSize, datatype());
            PtexUtils::interleave(tmp, uw * DataSize(datatype()), uw, vw,
                                  pf->data(), uw * _pixelsize,
                                  datatype(), _header.nchannels);
            if (levelid==0 && _premultiply && _header.hasAlpha())
                PtexUtils::multalpha(pf->data(), npixels, datatype(),
                                     _header.nchannels, _header.alphachan);
            if (useNew) delete [] tmp;
        }
        break;
    }

    if (!newface) newface = errorData();

    AtomicStore(&face, newface);
    increaseMemUsed(newMemUsed);
}